

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composite_sinusoidal_modeling_to_autocorrelation.cc
# Opt level: O0

bool __thiscall
sptk::CompositeSinusoidalModelingToAutocorrelation::Run
          (CompositeSinusoidalModelingToAutocorrelation *this,
          vector<double,_std::allocator<double>_> *input_and_output)

{
  vector<double,_std::allocator<double>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  vector<double,_std::allocator<double>_> input;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffc0;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  byte bVar1;
  
  if (in_RSI == (vector<double,_std::allocator<double>_> *)0x0) {
    bVar1 = 0;
  }
  else {
    std::vector<double,_std::allocator<double>_>::vector
              (unaff_retaddr,
               (vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
    bVar1 = Run((CompositeSinusoidalModelingToAutocorrelation *)
                CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),in_RDI,in_RSI);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffffc0);
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool CompositeSinusoidalModelingToAutocorrelation::Run(
    std::vector<double>* input_and_output) const {
  if (NULL == input_and_output) return false;
  std::vector<double> input(*input_and_output);
  return Run(input, input_and_output);
}